

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_view.h
# Opt level: O2

void __thiscall
bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
::increment(packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
            *this,size_t begin,size_t end,size_t n,overflow_opt opt)

{
  size_t end_00;
  word_type wVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong begin_00;
  
  uVar2 = this->_width;
  uVar6 = (end - begin) * uVar2;
  uVar7 = 0x40 - 0x40U % uVar2;
  uVar4 = uVar6 % uVar7;
  begin_00 = begin * uVar2;
  while (begin_00 < uVar2 * end) {
    uVar2 = uVar4;
    if (uVar7 <= uVar6) {
      uVar2 = uVar7;
    }
    end_00 = uVar2 + begin_00;
    wVar1 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::get
                      (&this->_bits,begin_00,end_00);
    uVar5 = 0xffffffffffffffff >> ((ulong)(byte)-(char)uVar2 & 0x3f);
    uVar3 = this->_field_mask * n & uVar5;
    if (uVar2 == 0) {
      uVar3 = 0;
    }
    wVar1 = uVar3 + wVar1 & uVar5;
    if (uVar2 == 0) {
      wVar1 = 0;
    }
    bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::set
              (&this->_bits,begin_00,end_00,wVar1);
    uVar6 = uVar6 - uVar2;
    begin_00 = end_00;
    uVar2 = this->_width;
  }
  return;
}

Assistant:

void packed_view<C>::increment(size_t begin, size_t end,
                                       size_t n, overflow_opt opt)
        {
            size_t fields_per_word = W / width();
            size_t bits_per_word = fields_per_word * width(); // It's not useless
            size_t len = (end - begin) * width();
            size_t rem = len % bits_per_word;
            
            for(size_t step, p = begin * width();
                p < end * width();
                len -= step, p += step)
            {
                step = len < bits_per_word ? rem : bits_per_word;
                
                word_type result = _bits.get(p, p + step) +
                lowbits(field_mask() * n, step);
                
                if(opt == cant_overflow)
                    ensure_bitsize(result, step);
                
                _bits.set(p, p + step, lowbits(result, step));
            }
        }